

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_countSeqStoreLiteralsBytes(seqStore_t *seqStore)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = (long)seqStore->sequences - (long)seqStore->sequencesStart;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 3;
    sVar1 = 0;
    uVar3 = 0;
    do {
      sVar1 = seqStore->sequencesStart[uVar3].litLength + sVar1;
      if ((seqStore->longLengthPos == uVar3) && (seqStore->longLengthType == ZSTD_llt_literalLength)
         ) {
        sVar1 = sVar1 + 0x10000;
      }
      uVar3 = uVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != uVar3);
    return sVar1;
  }
  return 0;
}

Assistant:

static size_t ZSTD_countSeqStoreLiteralsBytes(const seqStore_t* const seqStore)
{
    size_t literalsBytes = 0;
    size_t const nbSeqs = (size_t)(seqStore->sequences - seqStore->sequencesStart);
    size_t i;
    for (i = 0; i < nbSeqs; ++i) {
        seqDef const seq = seqStore->sequencesStart[i];
        literalsBytes += seq.litLength;
        if (i == seqStore->longLengthPos && seqStore->longLengthType == ZSTD_llt_literalLength) {
            literalsBytes += 0x10000;
    }   }
    return literalsBytes;
}